

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.cpp
# Opt level: O1

string * __thiscall
antlr::InputBuffer::getMarkedChars_abi_cxx11_(string *__return_storage_ptr__,InputBuffer *this)

{
  ulong uVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->markerOffset != 0) {
    uVar1 = 0;
    do {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->markerOffset);
  }
  return __return_storage_ptr__;
}

Assistant:

string InputBuffer::getMarkedChars( void ) const
{
	ANTLR_USE_NAMESPACE(std)string ret;

	for(unsigned int i = 0; i < markerOffset; i++)
		ret += queue.elementAt(i);

	return ret;
}